

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Token * __thiscall JSON::Parser::readToken(Token *__return_storage_ptr__,Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  size_type *psVar6;
  uint code;
  int current;
  string *this_00;
  allocator local_e9;
  size_type *local_e8 [2];
  size_type local_d8;
  undefined8 uStack_d0;
  size_type *local_c8 [2];
  size_type local_b8;
  undefined8 uStack_b0;
  size_type *local_a8 [2];
  size_type local_98;
  undefined8 uStack_90;
  size_type *local_88 [2];
  size_type local_78;
  undefined8 uStack_70;
  size_type *local_68 [2];
  size_type local_58;
  undefined8 uStack_50;
  size_type *local_48 [2];
  size_type local_38;
  undefined8 uStack_30;
  
  bVar2 = (this->input)._M_dataplus._M_p[this->pos];
  bVar4 = isNumberChar((uint)bVar2);
  if ((~bVar4 & bVar2 != 0x2d) == 0) {
    readNumberToken(__return_storage_ptr__,this);
  }
  else {
    code = (uint)bVar2;
    bVar4 = isWordChar(code);
    if (bVar4) {
      readWordToken(__return_storage_ptr__,this);
    }
    else if (code == 0x22) {
      readStringToken(__return_storage_ptr__,this);
    }
    else {
      current = this->pos;
      if (code == 0x2c) {
        this->pos = current + 1;
        std::__cxx11::string::string((string *)local_e8,",",&local_e9);
        iVar5 = this->pos;
        __return_storage_ptr__->type = COMMA;
        paVar1 = &(__return_storage_ptr__->value).field_2;
        (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
        psVar6 = &local_d8;
        if (local_e8[0] == psVar6) {
          paVar1->_M_allocated_capacity = local_d8;
          *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_d0;
        }
        else {
          (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)local_e8[0];
          (__return_storage_ptr__->value).field_2._M_allocated_capacity = local_d8;
        }
        this_00 = (string *)local_e8;
      }
      else if (code == 0x3a) {
        this->pos = current + 1;
        std::__cxx11::string::string((string *)local_c8,":",&local_e9);
        iVar5 = this->pos;
        __return_storage_ptr__->type = SEPARATOR;
        paVar1 = &(__return_storage_ptr__->value).field_2;
        (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
        psVar6 = &local_b8;
        if (local_c8[0] == psVar6) {
          paVar1->_M_allocated_capacity = local_b8;
          *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_b0;
        }
        else {
          (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)local_c8[0];
          (__return_storage_ptr__->value).field_2._M_allocated_capacity = local_b8;
        }
        this_00 = (string *)local_c8;
      }
      else if (bVar2 == 0x5b) {
        this->pos = current + 1;
        std::__cxx11::string::string((string *)local_88,"[",&local_e9);
        iVar5 = this->pos;
        __return_storage_ptr__->type = BRACKETS_START;
        paVar1 = &(__return_storage_ptr__->value).field_2;
        (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
        psVar6 = &local_78;
        if (local_88[0] == psVar6) {
          paVar1->_M_allocated_capacity = local_78;
          *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_70;
        }
        else {
          (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)local_88[0];
          (__return_storage_ptr__->value).field_2._M_allocated_capacity = local_78;
        }
        this_00 = (string *)local_88;
      }
      else if (bVar2 == 0x5d) {
        this->pos = current + 1;
        std::__cxx11::string::string((string *)local_a8,"]",&local_e9);
        iVar5 = this->pos;
        __return_storage_ptr__->type = BRACKETS_END;
        paVar1 = &(__return_storage_ptr__->value).field_2;
        (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
        psVar6 = &local_98;
        if (local_a8[0] == psVar6) {
          paVar1->_M_allocated_capacity = local_98;
          *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_90;
        }
        else {
          (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)local_a8[0];
          (__return_storage_ptr__->value).field_2._M_allocated_capacity = local_98;
        }
        this_00 = (string *)local_a8;
      }
      else if (bVar2 == 0x7d) {
        this->pos = current + 1;
        std::__cxx11::string::string((string *)local_68,"}",&local_e9);
        iVar5 = this->pos;
        __return_storage_ptr__->type = BRACES_END;
        paVar1 = &(__return_storage_ptr__->value).field_2;
        (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
        psVar6 = &local_58;
        if (local_68[0] == psVar6) {
          paVar1->_M_allocated_capacity = local_58;
          *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_50;
        }
        else {
          (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)local_68[0];
          (__return_storage_ptr__->value).field_2._M_allocated_capacity = local_58;
        }
        this_00 = (string *)local_68;
      }
      else {
        if (bVar2 != 0x7b) {
          unexpected(this,current);
          return (Token *)(ulong)(byte)(this->input)._M_dataplus._M_p[current];
        }
        this->pos = current + 1;
        std::__cxx11::string::string((string *)local_48,"{",&local_e9);
        iVar5 = this->pos;
        __return_storage_ptr__->type = BRACES_START;
        paVar1 = &(__return_storage_ptr__->value).field_2;
        (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
        psVar6 = &local_38;
        if (local_48[0] == psVar6) {
          paVar1->_M_allocated_capacity = local_38;
          *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_30;
        }
        else {
          (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)local_48[0];
          (__return_storage_ptr__->value).field_2._M_allocated_capacity = local_38;
        }
        this_00 = (string *)local_48;
      }
      sVar3 = *(size_type *)(this_00 + 8);
      *(size_type **)this_00 = psVar6;
      *(undefined8 *)(this_00 + 8) = 0;
      (__return_storage_ptr__->value)._M_string_length = sVar3;
      this_00[0x10] = (string)0x0;
      __return_storage_ptr__->start = current;
      __return_storage_ptr__->end = iVar5;
      std::__cxx11::string::~string(this_00);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Token Parser::readToken() {
        int code = getCodeAt(pos);

        if (isNumberChar(code) || code == 45) { // 0-9 or '-'
            return readNumberToken();
        } else if (isWordChar(code)) { // A-Z or a-z
            return readWordToken();
        }

        int startPos = pos;
        switch (code) {
            case 123: // '{'
                pos++;
                return Token(BRACES_START, "{", startPos, pos);
            case 125: // '}'
                pos++;
                return Token(BRACES_END, "}", startPos, pos);
            case 91: // '['
                pos++;
                return Token(BRACKETS_START, "[", startPos, pos);
            case 93: // ']'
                pos++;
                return Token(BRACKETS_END, "]", startPos, pos);
            case 58: // ':'
                pos++;
                return Token(SEPARATOR, ":", startPos, pos);
            case 44: // ','
                pos++;
                return Token(COMMA, ",", startPos, pos);
            case 34: // '"'
                return readStringToken();
            default:;
                unexpected(pos);
        }
    }